

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

int tlstran_ep_init_listener(void *arg,nng_url *url,nni_listener *nlistener)

{
  char cVar1;
  int iVar2;
  nni_sock *sock;
  
  sock = nni_listener_sock(nlistener);
  tlstran_ep_init((tlstran_ep *)arg,sock,tlstran_accept_cb);
  *(nni_listener **)((long)arg + 0x70) = nlistener;
  cVar1 = *url->u_path;
  iVar2 = 0xf;
  if ((((cVar1 == '\0') || ((cVar1 == '/' && (url->u_path[1] == '\0')))) &&
      (url->u_fragment == (char *)0x0)) &&
     ((url->u_userinfo == (char *)0x0 && (url->u_query == (char *)0x0)))) {
    iVar2 = nng_stream_listener_alloc_url((nng_stream_listener **)((long)arg + 0x60),url);
    if (iVar2 == 0) {
      nni_listener_add_stat(nlistener,(nni_stat_item *)((long)arg + 0x4d0));
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
tlstran_ep_init_listener(void *arg, nng_url *url, nni_listener *nlistener)
{
	tlstran_ep *ep = arg;
	int         rv;
	nni_sock   *sock = nni_listener_sock(nlistener);

	tlstran_ep_init(ep, sock, tlstran_accept_cb);
	ep->nlistener = nlistener;

	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}
	if ((rv = nng_stream_listener_alloc_url(&ep->listener, url)) != 0) {
		return (rv);
	}

#ifdef NNG_ENABLE_STATS
	nni_listener_add_stat(nlistener, &ep->st_rcv_max);
#endif
	return (0);
}